

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clipper.cpp
# Opt level: O2

void __thiscall ClipperLib::Clipper::AddLocalMaxPoly(Clipper *this,TEdge *e1,TEdge *e2,IntPoint *Pt)

{
  TEdge *e2_00;
  
  AddOutPt(this,e1,Pt);
  if (e2->WindDelta == 0) {
    AddOutPt(this,e2,Pt);
  }
  if (e1->OutIdx != e2->OutIdx) {
    e2_00 = e1;
    if (e1->OutIdx < e2->OutIdx) {
      e2_00 = e2;
      e2 = e1;
    }
    AppendPolygon(this,e2,e2_00);
    return;
  }
  e1->OutIdx = -1;
  e2->OutIdx = -1;
  return;
}

Assistant:

void Clipper::AddLocalMaxPoly(TEdge *e1, TEdge *e2, const IntPoint &Pt)
{
  AddOutPt( e1, Pt );
  if (e2->WindDelta == 0) AddOutPt(e2, Pt);
  if( e1->OutIdx == e2->OutIdx )
  {
    e1->OutIdx = Unassigned;
    e2->OutIdx = Unassigned;
  }
  else if (e1->OutIdx < e2->OutIdx) 
    AppendPolygon(e1, e2); 
  else 
    AppendPolygon(e2, e1);
}